

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

bool nullcInitTypeinfoModule(Linker *linker)

{
  nullres nVar1;
  Linker *linker_local;
  
  NULLCTypeInfo::linker = linker;
  nVar1 = nullcBindModuleFunctionHelper<int,int>
                    ("std.typeinfo",NULLCTypeInfo::IsFunction,"isFunction",0);
  if (nVar1 == '\0') {
    linker_local._7_1_ = false;
  }
  else {
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCRef>
                      ("std.typeinfo",NULLCTypeInfo::IsFunctionRef,"isFunction",1);
    if (nVar1 == '\0') {
      linker_local._7_1_ = false;
    }
    else {
      nVar1 = nullcBindModuleFunctionHelper<int,int>
                        ("std.typeinfo",NULLCTypeInfo::IsClass,"isClass",0);
      if (nVar1 == '\0') {
        linker_local._7_1_ = false;
      }
      else {
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCRef>
                          ("std.typeinfo",NULLCTypeInfo::IsClassRef,"isClass",1);
        if (nVar1 == '\0') {
          linker_local._7_1_ = false;
        }
        else {
          nVar1 = nullcBindModuleFunctionHelper<int,int>
                            ("std.typeinfo",NULLCTypeInfo::IsSimple,"isSimple",0);
          if (nVar1 == '\0') {
            linker_local._7_1_ = false;
          }
          else {
            nVar1 = nullcBindModuleFunctionHelper<int,NULLCRef>
                              ("std.typeinfo",NULLCTypeInfo::IsSimpleRef,"isSimple",1);
            if (nVar1 == '\0') {
              linker_local._7_1_ = false;
            }
            else {
              nVar1 = nullcBindModuleFunctionHelper<int,int>
                                ("std.typeinfo",NULLCTypeInfo::IsArray,"isArray",0);
              if (nVar1 == '\0') {
                linker_local._7_1_ = false;
              }
              else {
                nVar1 = nullcBindModuleFunctionHelper<int,NULLCRef>
                                  ("std.typeinfo",NULLCTypeInfo::IsArrayRef,"isArray",1);
                if (nVar1 == '\0') {
                  linker_local._7_1_ = false;
                }
                else {
                  nVar1 = nullcBindModuleFunctionHelper<int,int>
                                    ("std.typeinfo",NULLCTypeInfo::IsPointer,"isPointer",0);
                  if (nVar1 == '\0') {
                    linker_local._7_1_ = false;
                  }
                  else {
                    nVar1 = nullcBindModuleFunctionHelper<int,NULLCRef>
                                      ("std.typeinfo",NULLCTypeInfo::IsPointerRef,"isPointer",1);
                    if (nVar1 == '\0') {
                      linker_local._7_1_ = false;
                    }
                    else {
                      nVar1 = nullcBindModuleFunctionHelper<int,int*>
                                        ("std.typeinfo",NULLCTypeInfo::MemberCount,
                                         "typeid::memberCount",0);
                      if (nVar1 == '\0') {
                        linker_local._7_1_ = false;
                      }
                      else {
                        nVar1 = nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,int,int*>
                                          ("std.typeinfo",NULLCTypeInfo::MemberType,
                                           "typeid::memberType",0);
                        if (nVar1 == '\0') {
                          linker_local._7_1_ = false;
                        }
                        else {
                          nVar1 = nullcBindModuleFunctionHelper<NULLCArray,int,int*>
                                            ("std.typeinfo",NULLCTypeInfo::MemberName,
                                             "typeid::memberName",0);
                          if (nVar1 == '\0') {
                            linker_local._7_1_ = false;
                          }
                          else {
                            nVar1 = nullcBindModuleFunctionHelper<NULLCArray,int*>
                                              ("std.typeinfo",NULLCTypeInfo::TypeName,
                                               "typeid::name$",0);
                            if (nVar1 == '\0') {
                              linker_local._7_1_ = false;
                            }
                            else {
                              nVar1 = nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,int*>
                                                ("std.typeinfo",NULLCTypeInfo::TypeSubType,
                                                 "typeid::subType",0);
                              if (nVar1 == '\0') {
                                linker_local._7_1_ = false;
                              }
                              else {
                                nVar1 = nullcBindModuleFunctionHelper<int,int*>
                                                  ("std.typeinfo",NULLCTypeInfo::TypeArraySize,
                                                   "typeid::arraySize",0);
                                if (nVar1 == '\0') {
                                  linker_local._7_1_ = false;
                                }
                                else {
                                  nVar1 = nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,int*>
                                                    ("std.typeinfo",NULLCTypeInfo::TypeReturnType,
                                                     "typeid::returnType",0);
                                  if (nVar1 == '\0') {
                                    linker_local._7_1_ = false;
                                  }
                                  else {
                                    nVar1 = nullcBindModuleFunctionHelper<int,int*>
                                                      ("std.typeinfo",
                                                       NULLCTypeInfo::TypeArgumentCount,
                                                       "typeid::argumentCount",0);
                                    if (nVar1 == '\0') {
                                      linker_local._7_1_ = false;
                                    }
                                    else {
                                      nVar1 = nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,int,int*>
                                                        ("std.typeinfo",
                                                         NULLCTypeInfo::TypeArgumentType,
                                                         "typeid::argumentType",0);
                                      if (nVar1 == '\0') {
                                        linker_local._7_1_ = false;
                                      }
                                      else {
                                        nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCRef,int>
                                                          ("std.typeinfo",
                                                           NULLCTypeInfo::MemberByIndex,
                                                           "typeGetMember",0);
                                        if (nVar1 == '\0') {
                                          linker_local._7_1_ = false;
                                        }
                                        else {
                                          nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCRef,NULLCArray>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::MemberByName,
                                                             "typeGetMember",1);
                                          if (nVar1 == '\0') {
                                            linker_local._7_1_ = false;
                                          }
                                          else {
                                            nVar1 = nullcBindModuleFunctionHelper<NULLCRef,NULLCRef>
                                                              ("std.typeinfo",
                                                               NULLCTypeInfo::GetPointerTarget,
                                                               "pointerGetTarget",0);
                                            if (nVar1 == '\0') {
                                              linker_local._7_1_ = false;
                                            }
                                            else {
                                              nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,NULLCArray>
                                                            ("std.typeinfo",NULLCTypeInfo::GetType,
                                                             "getType",0);
                                              if (nVar1 == '\0') {
                                                linker_local._7_1_ = false;
                                              }
                                              else {
                                                nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCRef,NULLCArray>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetInstanceByName,
                                                             "createInstanceByName",0);
                                                if (nVar1 == '\0') {
                                                  linker_local._7_1_ = false;
                                                }
                                                else {
                                                  nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCRef,NULLCTypeInfo::TypeID>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetInstanceByType,
                                                             "createInstanceByType",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCAutoArray,NULLCArray,unsigned_int>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetArrayByName,
                                                             "createArrayByName",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCAutoArray,NULLCTypeInfo::TypeID,unsigned_int>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetArrayByType,
                                                             "createArrayByType",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCTypeInfo::TypeID,NULLCRef>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetFunctionContextType,
                                                             "functionGetContextType",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<NULLCRef,NULLCRef>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::GetFunctionContext,
                                                             "functionGetContext",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    nVar1 = 
                                                  nullcBindModuleFunctionHelper<void,NULLCRef,NULLCRef>
                                                            ("std.typeinfo",
                                                             NULLCTypeInfo::SetFunctionContext,
                                                             "functionSetContext",0);
                                                  if (nVar1 == '\0') {
                                                    linker_local._7_1_ = false;
                                                  }
                                                  else {
                                                    linker_local._7_1_ = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return linker_local._7_1_;
}

Assistant:

bool	nullcInitTypeinfoModule(Linker* linker)
{
	NULLCTypeInfo::linker = linker;

	REGISTER_FUNC(IsFunction, "isFunction", 0);
	REGISTER_FUNC(IsFunctionRef, "isFunction", 1);
	REGISTER_FUNC(IsClass, "isClass", 0);
	REGISTER_FUNC(IsClassRef, "isClass", 1);
	REGISTER_FUNC(IsSimple, "isSimple", 0);
	REGISTER_FUNC(IsSimpleRef, "isSimple", 1);
	REGISTER_FUNC(IsArray, "isArray", 0);
	REGISTER_FUNC(IsArrayRef, "isArray", 1);
	REGISTER_FUNC(IsPointer, "isPointer", 0);
	REGISTER_FUNC(IsPointerRef, "isPointer", 1);

	REGISTER_FUNC(MemberCount, "typeid::memberCount", 0);
	REGISTER_FUNC(MemberType, "typeid::memberType", 0);
	REGISTER_FUNC(MemberName, "typeid::memberName", 0);

	REGISTER_FUNC(TypeName, "typeid::name$", 0);

	REGISTER_FUNC(TypeSubType, "typeid::subType", 0);
	REGISTER_FUNC(TypeArraySize, "typeid::arraySize", 0);
	REGISTER_FUNC(TypeReturnType, "typeid::returnType", 0);
	REGISTER_FUNC(TypeArgumentCount, "typeid::argumentCount", 0);
	REGISTER_FUNC(TypeArgumentType, "typeid::argumentType", 0);

	REGISTER_FUNC(MemberByIndex, "typeGetMember", 0);
	REGISTER_FUNC(MemberByName, "typeGetMember", 1);

	REGISTER_FUNC(GetPointerTarget, "pointerGetTarget", 0);

	REGISTER_FUNC(GetType, "getType", 0);
	REGISTER_FUNC(GetInstanceByName, "createInstanceByName", 0);
	REGISTER_FUNC(GetInstanceByType, "createInstanceByType", 0);
	REGISTER_FUNC(GetArrayByName, "createArrayByName", 0);
	REGISTER_FUNC(GetArrayByType, "createArrayByType", 0);

	REGISTER_FUNC(GetFunctionContextType, "functionGetContextType", 0);
	REGISTER_FUNC(GetFunctionContext, "functionGetContext", 0);
	REGISTER_FUNC(SetFunctionContext, "functionSetContext", 0);

	return true;
}